

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioUtil.c
# Opt level: O1

void Io_WriteHie(Abc_Ntk_t *pNtk,char *pBaseName,char *pFileName)

{
  uint uVar1;
  Abc_NtkFunc_t AVar2;
  Io_FileType_t IVar3;
  int iVar4;
  Abc_Ntk_t *pAVar5;
  Abc_Ntk_t *pNtkH;
  Abc_Ntk_t *pAVar6;
  Vec_Ptr_t *pVVar7;
  char *__format;
  long lVar8;
  
  if (pNtk == (Abc_Ntk_t *)0x0) {
    fwrite("Empty network.\n",0xf,1,_stdout);
    return;
  }
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                  ,0x1ef,"void Io_WriteHie(Abc_Ntk_t *, char *, char *)");
  }
  IVar3 = Io_ReadFileType(pBaseName);
  if (IVar3 == IO_FILE_BLIF) {
    iVar4 = 0;
LAB_00336a2c:
    pAVar5 = Io_ReadBlifMv(pBaseName,iVar4,1);
  }
  else {
    IVar3 = Io_ReadFileType(pBaseName);
    if (IVar3 == IO_FILE_BLIFMV) {
      iVar4 = 1;
      goto LAB_00336a2c;
    }
    IVar3 = Io_ReadFileType(pBaseName);
    if (IVar3 == IO_FILE_VERILOG) {
      pAVar5 = Io_ReadVerilog(pBaseName,1);
    }
    else {
      Io_WriteHie_cold_1();
      pAVar5 = (Abc_Ntk_t *)0x0;
    }
  }
  if (pAVar5 == (Abc_Ntk_t *)0x0) {
    return;
  }
  pNtkH = pAVar5;
  if ((0 < pAVar5->nObjCounts[9]) && (pNtk->nBarBufs == 0)) {
    pNtkH = Abc_NtkFlattenLogicHierarchy(pAVar5);
    Abc_NtkDelete(pAVar5);
    if (pNtkH == (Abc_Ntk_t *)0x0) {
      return;
    }
  }
  if (pNtk->nBarBufs < 1) {
    IVar3 = Io_ReadFileType(pBaseName);
    if (IVar3 == IO_FILE_BLIFMV) {
      pAVar5 = pNtkH;
      if (0 < pNtkH->nObjCounts[10]) {
        puts("Hierarchy writer does not support BLIF-MV with blackboxes.");
        goto LAB_00336d06;
      }
      if (pNtk->ntkType == ABC_NTK_NETLIST) {
        __assert_fail("!Abc_NtkIsNetlist(pNtk)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioUtil.c"
                      ,0x217,"void Io_WriteHie(Abc_Ntk_t *, char *, char *)");
      }
      pAVar6 = Abc_NtkToNetlist(pNtk);
      iVar4 = Abc_NtkConvertToBlifMv(pAVar6);
      if (iVar4 == 0) goto LAB_00336d06;
      pAVar5 = Abc_NtkInsertBlifMv(pNtkH,pAVar6);
      Abc_NtkDelete(pAVar6);
    }
    else {
      if (0 < pNtkH->nObjCounts[10]) {
        pAVar6 = Abc_NtkToNetlist(pNtk);
        pAVar5 = Abc_NtkInsertNewLogic(pNtkH,pAVar6);
        Abc_NtkDelete(pAVar6);
        if (pAVar5 == (Abc_Ntk_t *)0x0) goto LAB_00336b49;
        uVar1 = pNtkH->nObjCounts[10];
        __format = "Hierarchy writer reintroduced %d instances of blackboxes.\n";
        goto LAB_00336ad7;
      }
      puts("Warning: The output network does not contain blackboxes.");
      pAVar5 = Abc_NtkToNetlist(pNtk);
    }
  }
  else {
    pAVar6 = Abc_NtkToNetlist(pNtk);
    pAVar5 = Abc_NtkFromBarBufs(pNtkH,pAVar6);
    Abc_NtkDelete(pAVar6);
    if (pAVar5 == (Abc_Ntk_t *)0x0) {
LAB_00336b49:
      pAVar5 = (Abc_Ntk_t *)0x0;
    }
    else {
      uVar1 = pNtk->nBarBufs;
      __format = "Hierarchy writer replaced %d barbufs by hierarchy boundaries.\n";
LAB_00336ad7:
      printf(__format,(ulong)uVar1);
    }
  }
  Abc_NtkDelete(pNtkH);
  if (pAVar5 == (Abc_Ntk_t *)0x0) {
    return;
  }
  IVar3 = Io_ReadFileType(pFileName);
  if (IVar3 == IO_FILE_BLIF) {
    if (pAVar5->pDesign == (Abc_Des_t *)0x0) {
      if ((pAVar5->ntkFunc != ABC_FUNC_SOP) && (pAVar5->ntkFunc != ABC_FUNC_MAP)) {
        Abc_NtkToSop(pAVar5,-1,1000000000);
      }
    }
    else {
      pVVar7 = pAVar5->pDesign->vModules;
      if (0 < pVVar7->nSize) {
        lVar8 = 0;
        do {
          AVar2 = ((Abc_Ntk_t *)pVVar7->pArray[lVar8])->ntkFunc;
          if ((AVar2 != ABC_FUNC_SOP) && (AVar2 != ABC_FUNC_MAP)) {
            Abc_NtkToSop((Abc_Ntk_t *)pVVar7->pArray[lVar8],-1,1000000000);
          }
          lVar8 = lVar8 + 1;
          pVVar7 = pAVar5->pDesign->vModules;
        } while (lVar8 < pVVar7->nSize);
      }
    }
    Io_WriteBlif(pAVar5,pFileName,1,0,0);
  }
  else {
    IVar3 = Io_ReadFileType(pFileName);
    if (IVar3 == IO_FILE_VERILOG) {
      if (pAVar5->pDesign == (Abc_Des_t *)0x0) {
        if (1 < pAVar5->ntkFunc - ABC_FUNC_AIG) {
          Abc_NtkToAig(pAVar5);
        }
      }
      else {
        pVVar7 = pAVar5->pDesign->vModules;
        if (0 < pVVar7->nSize) {
          lVar8 = 0;
          do {
            if (1 < ((Abc_Ntk_t *)pVVar7->pArray[lVar8])->ntkFunc - ABC_FUNC_AIG) {
              Abc_NtkToAig((Abc_Ntk_t *)pVVar7->pArray[lVar8]);
            }
            lVar8 = lVar8 + 1;
            pVVar7 = pAVar5->pDesign->vModules;
          } while (lVar8 < pVVar7->nSize);
        }
      }
      Io_WriteVerilog(pAVar5,pFileName,0);
    }
    else {
      IVar3 = Io_ReadFileType(pFileName);
      if (IVar3 == IO_FILE_BLIFMV) {
        Io_WriteBlifMv(pAVar5,pFileName);
      }
      else {
        Io_WriteHie_cold_2();
      }
    }
  }
LAB_00336d06:
  Abc_NtkDelete(pAVar5);
  return;
}

Assistant:

void Io_WriteHie( Abc_Ntk_t * pNtk, char * pBaseName, char * pFileName )
{
    Abc_Ntk_t * pNtkTemp, * pNtkResult, * pNtkBase = NULL;
    int i;
    // check if the current network is available
    if ( pNtk == NULL )
    {
        fprintf( stdout, "Empty network.\n" );
        return;
    }

    // read the base network
    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );
    if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIF )
        pNtkBase = Io_ReadBlifMv( pBaseName, 0, 1 );
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIFMV )
        pNtkBase = Io_ReadBlifMv( pBaseName, 1, 1 );
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_VERILOG )
        pNtkBase = Io_ReadVerilog( pBaseName, 1 );
    else 
        fprintf( stderr, "Unknown input file format.\n" );
    if ( pNtkBase == NULL )
        return;

    // flatten logic hierarchy if present
    if ( Abc_NtkWhiteboxNum(pNtkBase) > 0 && pNtk->nBarBufs == 0 )
    {
        pNtkBase = Abc_NtkFlattenLogicHierarchy( pNtkTemp = pNtkBase );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkBase == NULL )
            return;
    }

    // reintroduce the boxes into the netlist
    if ( pNtk->nBarBufs > 0 )
    {
        // derive the netlist
        pNtkResult = Abc_NtkToNetlist( pNtk );
        pNtkResult = Abc_NtkFromBarBufs( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkResult )
            printf( "Hierarchy writer replaced %d barbufs by hierarchy boundaries.\n", pNtk->nBarBufs );
    }
    else if ( Io_ReadFileType(pBaseName) == IO_FILE_BLIFMV ) 
    {
        if ( Abc_NtkBlackboxNum(pNtkBase) > 0 )
        {
            printf( "Hierarchy writer does not support BLIF-MV with blackboxes.\n" );
            Abc_NtkDelete( pNtkBase );
            return;
        }
        // convert the current network to BLIF-MV
        assert( !Abc_NtkIsNetlist(pNtk) );
        pNtkResult = Abc_NtkToNetlist( pNtk );
        if ( !Abc_NtkConvertToBlifMv( pNtkResult ) )
        {
            Abc_NtkDelete( pNtkBase );
            return;
        }
        // reintroduce the network
        pNtkResult = Abc_NtkInsertBlifMv( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
    }
    else if ( Abc_NtkBlackboxNum(pNtkBase) > 0 )
    {
        // derive the netlist
        pNtkResult = Abc_NtkToNetlist( pNtk );
        pNtkResult = Abc_NtkInsertNewLogic( pNtkBase, pNtkTemp = pNtkResult );
        Abc_NtkDelete( pNtkTemp );
        if ( pNtkResult )
            printf( "Hierarchy writer reintroduced %d instances of blackboxes.\n", Abc_NtkBlackboxNum(pNtkBase) );
    }
    else
    {
        printf( "Warning: The output network does not contain blackboxes.\n" );
        pNtkResult = Abc_NtkToNetlist( pNtk );
    }
    Abc_NtkDelete( pNtkBase );
    if ( pNtkResult == NULL )
        return;

    // write the resulting network
    if ( Io_ReadFileType(pFileName) == IO_FILE_BLIF )
    {
        if ( pNtkResult->pDesign )
        {
            Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkResult->pDesign->vModules, pNtkTemp, i )
                if ( !Abc_NtkHasSop(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
                    Abc_NtkToSop( pNtkTemp, -1, ABC_INFINITY );
        }
        else
        {
            if ( !Abc_NtkHasSop(pNtkResult) && !Abc_NtkHasMapping(pNtkResult) )
                Abc_NtkToSop( pNtkResult, -1, ABC_INFINITY );
        }
        Io_WriteBlif( pNtkResult, pFileName, 1, 0, 0 );
    }
    else if ( Io_ReadFileType(pFileName) == IO_FILE_VERILOG )
    {
        if ( pNtkResult->pDesign )
        {
            Vec_PtrForEachEntry( Abc_Ntk_t *, pNtkResult->pDesign->vModules, pNtkTemp, i )
                if ( !Abc_NtkHasAig(pNtkTemp) && !Abc_NtkHasMapping(pNtkTemp) )
                    Abc_NtkToAig( pNtkTemp );
        }
        else
        {
            if ( !Abc_NtkHasAig(pNtkResult) && !Abc_NtkHasMapping(pNtkResult) )
                Abc_NtkToAig( pNtkResult );
        }
        Io_WriteVerilog( pNtkResult, pFileName, 0 );
    }
    else if ( Io_ReadFileType(pFileName) == IO_FILE_BLIFMV )
    {
        Io_WriteBlifMv( pNtkResult, pFileName );
    }
    else 
        fprintf( stderr, "Unknown output file format.\n" );

    Abc_NtkDelete( pNtkResult );
}